

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O0

void license::LicenseGenerator::generateAndOutputLicenses(variables_map *vm,ostream *outputFile)

{
  bool bVar1;
  pointer pFVar2;
  pointer pCVar3;
  string local_420 [8];
  string signature;
  string license;
  __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
  local_3d8;
  iterator it;
  size_t len;
  char pkey [888];
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> local_38;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> helper;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfo;
  ostream *outputFile_local;
  variables_map *vm_local;
  
  parseLicenseInfo((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                   &helper,vm);
  CryptoHelper::getInstance();
  memcpy(&len,
         "-----BEGIN RSA PRIVATE KEY-----\nMIICXQIBAAKBgQCviPE73nlzNBZDu/OCX46MLphkUh+Fkmr6t8LhqOYRRmy8Vu02\n1mGk7JppHDUPSAIjrCpHiWdPQxn2YnaRtHsxws/puoFq07jsGJ7Ry/m3RKAZop0t\np23jVdLwSMBn8/2WmqUSbafZxMtEgtWXed+vjLyC846WgXiDPaK7/UyC2QIDAQAB\nAoGAdUYvrUkIqTAug9hpazv+V6e1xqibSLk24gStnegitX3wnbAR0eZO3En7K6hd\nxrTcQQsAQEULkYgKK3NDNjt3Zf5cxlZl/PM+xTCXEoAh0zOjh+RuvC/q6wWX1xEY\nFWK1X64olRNvgOP3LUHta2dCRQSkvn6VnNQnvWFgzd6W3AECQQDlLpuKdg91bbe1\nUWIcFxcjPIlpFt8F3RpvAdIPhWg8B6rZHybi4VeLwfo6XcBAKQht8Y7O/NQWqsoq\nuSK+z1hZAkEAxBNHJC3tPNEgtiNB3Wf57A/wpkhAgGV18GgGUopIrPJeoroMYJlz\no2Tmz8sGv+11aWYSsjBSJ7P1gtR2DlkugQJBAKfPV76rsagHPXO7cn4k/iEj622S\nfJz7h6Zui9Qnl+oUpymyILQR0huYXlOsX9/a67wtGqc/A0DRr5RW2TUj94kCQHks\nBLoKG+OKxfFphonCeQP2sdzBKANxMFqantWhmdovimZ8HawRCRLAB5gAuzIfGIFD\nUGiITi01HJN2o2KooIECQQCHX3i87WU5EviWk55rBT5ZZ7EO/kl/2uKt7hr/BIz5\nB6EkqmXe82Yfr40Wc49MVLHdGUOXl+SD6BsuUHcK3BOA\n-----END RSA PRIVATE KEY-----\n"
         ,0x378);
  it._M_current = (FullLicenseInfo *)0x378;
  local_3d8._M_current =
       (FullLicenseInfo *)
       std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::begin
                 ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                  &helper);
  while( true ) {
    license.field_2._8_8_ =
         std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::end
                   ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                    &helper);
    bVar1 = __gnu_cxx::operator!=
                      (&local_3d8,
                       (__normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                        *)((long)&license.field_2 + 8));
    if (!bVar1) break;
    pFVar2 = __gnu_cxx::
             __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
             ::operator->(&local_3d8);
    FullLicenseInfo::printForSign_abi_cxx11_((string *)((long)&signature.field_2 + 8),pFVar2);
    pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
             operator->(&local_38);
    (**(code **)(*(long *)pCVar3 + 0x18))
              (local_420,pCVar3,&len,it._M_current,(undefined1 *)((long)&signature.field_2 + 8));
    pFVar2 = __gnu_cxx::
             __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
             ::operator->(&local_3d8);
    std::__cxx11::string::operator=((string *)&pFVar2->license_signature,local_420);
    pFVar2 = __gnu_cxx::
             __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
             ::operator->(&local_3d8);
    FullLicenseInfo::printAsIni(pFVar2,outputFile);
    std::__cxx11::string::~string(local_420);
    std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
    ::operator++(&local_3d8);
  }
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            (&local_38);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)&helper)
  ;
  return;
}

Assistant:

void LicenseGenerator::generateAndOutputLicenses(const po::variables_map& vm,
		ostream& outputFile) {
	vector<FullLicenseInfo> licenseInfo = parseLicenseInfo(vm);
	unique_ptr<CryptoHelper> helper = CryptoHelper::getInstance();
	const char pkey[] = PRIVATE_KEY;
	size_t len = sizeof(pkey);
	for (auto it = licenseInfo.begin(); it != licenseInfo.end(); ++it) {
		const string license = it->printForSign();
		string signature = helper->signString((const void *)pkey,len,license);
		it->license_signature = signature;
		it->printAsIni(outputFile);
	}
}